

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Importer::ImportNodes(glTF2Importer *this,Asset *r)

{
  uint uVar1;
  vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *pvVar2;
  aiNode *this_00;
  aiNode **ppaVar3;
  aiNode *paVar4;
  long lVar5;
  aiScene *pScene;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> rootNodes;
  allocator<char> local_69;
  _Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> local_68;
  string local_50;
  
  pvVar2 = (r->scene).vector;
  if (pvVar2 != (vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *)0x0) {
    std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::vector
              ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> *)
               &local_68,
               &(pvVar2->super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>).
                _M_impl.super__Vector_impl_data._M_start[(r->scene).index]->nodes);
    uVar6 = (long)local_68._M_impl.super__Vector_impl_data._M_finish -
            (long)local_68._M_impl.super__Vector_impl_data._M_start;
    uVar8 = uVar6 >> 4;
    iVar7 = (int)uVar8;
    if (iVar7 != 0) {
      if (iVar7 == 1) {
        this_00 = ImportNode(this->mScene,r,&this->meshOffsets,
                             local_68._M_impl.super__Vector_impl_data._M_start);
        pScene = this->mScene;
      }
      else {
        this_00 = (aiNode *)operator_new(0x478);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"ROOT",&local_69);
        aiNode::aiNode(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        ppaVar3 = (aiNode **)operator_new__(uVar6 >> 1 & 0x7fffffff8);
        this_00->mChildren = ppaVar3;
        for (lVar5 = 0; pScene = this->mScene, (uVar8 & 0xffffffff) << 4 != lVar5;
            lVar5 = lVar5 + 0x10) {
          paVar4 = ImportNode(pScene,r,&this->meshOffsets,
                              (Ref<glTF2::Node> *)
                              ((long)&(local_68._M_impl.super__Vector_impl_data._M_start)->vector +
                              lVar5));
          paVar4->mParent = this_00;
          uVar1 = this_00->mNumChildren;
          this_00->mNumChildren = uVar1 + 1;
          this_00->mChildren[uVar1] = paVar4;
        }
      }
      pScene->mRootNode = this_00;
    }
    std::_Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
    ~_Vector_base(&local_68);
  }
  return;
}

Assistant:

static inline void SetFace(aiFace& face, int a, int b)
{
    face.mNumIndices = 2;
    face.mIndices = new unsigned int[2];
    face.mIndices[0] = a;
    face.mIndices[1] = b;
}